

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::StringTree::concat<kj::String,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,String *params,
          ArrayPtr<const_char> *params_1)

{
  size_t sVar1;
  String *pSVar2;
  ArrayPtr<const_char> *pAVar3;
  char *pos;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  size_type extraout_RDX_01;
  initializer_list<unsigned_long> nums;
  initializer_list<unsigned_long> nums_00;
  initializer_list<unsigned_long> nums_01;
  size_t local_c8;
  size_t local_c0;
  _ *local_b8;
  undefined8 local_b0;
  Array<kj::StringTree::Branch> local_a8;
  size_t local_90;
  size_t local_88;
  _ *local_80;
  undefined8 local_78;
  String local_70;
  size_t local_48;
  size_t local_40;
  _ *local_38;
  undefined8 local_30;
  undefined1 local_21;
  ArrayPtr<const_char> *local_20;
  ArrayPtr<const_char> *params_local_1;
  String *params_local;
  StringTree *result;
  
  local_21 = 0;
  local_20 = (ArrayPtr<const_char> *)params;
  params_local_1 = (ArrayPtr<const_char> *)this;
  params_local = (String *)__return_storage_ptr__;
  StringTree(__return_storage_ptr__);
  local_48 = String::size((String *)params_local_1);
  local_40 = ArrayPtr<const_char>::size(local_20);
  local_38 = (_ *)&local_48;
  local_30 = 2;
  nums._M_len = extraout_RDX;
  nums._M_array = (iterator)0x2;
  sVar1 = _::sum(local_38,nums);
  __return_storage_ptr__->size_ = sVar1;
  pSVar2 = fwd<kj::String>((NoInfer<kj::String> *)params_local_1);
  local_90 = flatSize(pSVar2);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(local_20);
  local_88 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  local_80 = (_ *)&local_90;
  local_78 = 2;
  nums_00._M_len = extraout_RDX_00;
  nums_00._M_array = (iterator)0x2;
  sVar1 = _::sum(local_80,nums_00);
  heapString(&local_70,sVar1);
  String::operator=(&__return_storage_ptr__->text,&local_70);
  String::~String(&local_70);
  pSVar2 = fwd<kj::String>((NoInfer<kj::String> *)params_local_1);
  local_c8 = branchCount(pSVar2);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(local_20);
  local_c0 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  local_b8 = (_ *)&local_c8;
  local_b0 = 2;
  nums_01._M_len = extraout_RDX_01;
  nums_01._M_array = (iterator)0x2;
  sVar1 = _::sum(local_b8,nums_01);
  heapArray<kj::StringTree::Branch>(&local_a8,sVar1);
  Array<kj::StringTree::Branch>::operator=(&__return_storage_ptr__->branches,&local_a8);
  Array<kj::StringTree::Branch>::~Array(&local_a8);
  pos = String::begin(&__return_storage_ptr__->text);
  pSVar2 = fwd<kj::String>((NoInfer<kj::String> *)params_local_1);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(local_20);
  fill<kj::ArrayPtr<char_const>>(__return_storage_ptr__,pos,0,pSVar2,pAVar3);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}